

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSurfaceNurbs.cpp
# Opt level: O1

void __thiscall
chrono::geometry::ChSurfaceNurbs::SetupData
          (ChSurfaceNurbs *this,int morder_u,int morder_v,ChMatrixDynamic<ChVector<>_> *mpoints,
          ChVectorDynamic<> *mknots_u,ChVectorDynamic<> *mknots_v,ChMatrixDynamic<> *weights)

{
  ChVectorDynamic<> *pCVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  Index IVar5;
  double *pdVar6;
  ulong uVar7;
  double *pdVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  Index size;
  ChException *pCVar17;
  ulong uVar18;
  ActualDstType actualDst_5;
  long lVar19;
  ActualDstType actualDst_2;
  ActualDstType actualDst_1;
  Scalar local_120;
  Index local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (morder_u < 1) {
    pCVar17 = (ChException *)__cxa_allocate_exception(0x28);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"ChSurfaceNurbs::SetupData requires u order >= 1.","");
    ChException::ChException(pCVar17,&local_50);
    __cxa_throw(pCVar17,&ChException::typeinfo,ChException::~ChException);
  }
  if (morder_v < 1) {
    pCVar17 = (ChException *)__cxa_allocate_exception(0x28);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"ChSurfaceNurbs::SetupData requires v order >= 1.","");
    ChException::ChException(pCVar17,&local_70);
    __cxa_throw(pCVar17,&ChException::typeinfo,ChException::~ChException);
  }
  lVar19 = (mpoints->
           super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>).
           m_storage.m_rows;
  if (lVar19 < (long)(ulong)(morder_u + 1)) {
    pCVar17 = (ChException *)__cxa_allocate_exception(0x28);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,
               "ChSurfaceNurbs::SetupData requires at least (order_u+1)x(order_v+1) control points."
               ,"");
    ChException::ChException(pCVar17,&local_90);
    __cxa_throw(pCVar17,&ChException::typeinfo,ChException::~ChException);
  }
  lVar4 = (mpoints->
          super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>).
          m_storage.m_cols;
  if (lVar4 < (long)(ulong)(morder_v + 1)) {
    pCVar17 = (ChException *)__cxa_allocate_exception(0x28);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,
               "ChSurfaceNurbs::SetupData requires at least (order_u+1)x(order_v+1) control points."
               ,"");
    ChException::ChException(pCVar17,&local_b0);
    __cxa_throw(pCVar17,&ChException::typeinfo,ChException::~ChException);
  }
  if ((mknots_u != (ChVectorDynamic<> *)0x0) &&
     ((mknots_u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      (ulong)(uint)morder_u + 1 + lVar19)) {
    pCVar17 = (ChException *)__cxa_allocate_exception(0x28);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,
               "ChSurfaceNurbs::SetupData: knots_u must have size=n_points_u+order_u+1","");
    ChException::ChException(pCVar17,&local_d0);
    __cxa_throw(pCVar17,&ChException::typeinfo,ChException::~ChException);
  }
  if ((mknots_v != (ChVectorDynamic<> *)0x0) &&
     ((mknots_v->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      (ulong)(uint)morder_v + 1 + lVar4)) {
    pCVar17 = (ChException *)__cxa_allocate_exception(0x28);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,
               "ChSurfaceNurbs::SetupData: knots_v must have size=n_points_v+order_v+1","");
    ChException::ChException(pCVar17,&local_f0);
    __cxa_throw(pCVar17,&ChException::typeinfo,ChException::~ChException);
  }
  if ((weights != (ChMatrixDynamic<> *)0x0) &&
     (((weights->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows
       != lVar19 ||
      ((weights->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols
       != lVar4)))) {
    pCVar17 = (ChException *)__cxa_allocate_exception(0x28);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,
               "ChSurfaceNurbs::SetupData: weights matrix must have size as point matrix","");
    ChException::ChException(pCVar17,&local_110);
    __cxa_throw(pCVar17,&ChException::typeinfo,ChException::~ChException);
  }
  this->p_u = morder_u;
  this->p_v = morder_v;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<chrono::ChVector<double>,_1,_1,1,_1,_1>,Eigen::Matrix<chrono::ChVector<double>,_1,_1,1,_1,_1>,Eigen::internal::assign_op<chrono::ChVector<double>,chrono::ChVector<double>>>
            (&this->points,mpoints,
             (assign_op<chrono::ChVector<double>,_chrono::ChVector<double>_> *)&local_120);
  local_118 = (this->points).
              super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows;
  IVar5 = (this->points).
          super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>.
          m_storage.m_cols;
  if (mknots_u == (ChVectorDynamic<> *)0x0) {
    pCVar1 = &this->knots_u;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)((int)local_118 + 1 + this->p_u));
    lVar19 = (this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    if (lVar19 < 0) goto LAB_0083199b;
    if (lVar19 != 0) {
      memset((pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar19 << 3);
    }
    ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(pCVar1,this->p_u,0.0,1.0);
  }
  else {
    pdVar6 = (mknots_u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar18 = (mknots_u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if ((this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != uVar18) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&(this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 uVar18,1);
    }
    uVar7 = (this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_rows;
    if (uVar7 != uVar18) goto LAB_008317ef;
    pdVar8 = (this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    uVar18 = uVar7 + 7;
    if (-1 < (long)uVar7) {
      uVar18 = uVar7;
    }
    uVar18 = uVar18 & 0xfffffffffffffff8;
    if (7 < (long)uVar7) {
      lVar19 = 0;
      do {
        pdVar3 = pdVar6 + lVar19;
        dVar10 = pdVar3[1];
        dVar11 = pdVar3[2];
        dVar12 = pdVar3[3];
        dVar13 = pdVar3[4];
        dVar14 = pdVar3[5];
        dVar15 = pdVar3[6];
        dVar16 = pdVar3[7];
        pdVar2 = pdVar8 + lVar19;
        *pdVar2 = *pdVar3;
        pdVar2[1] = dVar10;
        pdVar2[2] = dVar11;
        pdVar2[3] = dVar12;
        pdVar2[4] = dVar13;
        pdVar2[5] = dVar14;
        pdVar2[6] = dVar15;
        pdVar2[7] = dVar16;
        lVar19 = lVar19 + 8;
      } while (lVar19 < (long)uVar18);
    }
    if ((long)uVar18 < (long)uVar7) {
      do {
        pdVar8[uVar18] = pdVar6[uVar18];
        uVar18 = uVar18 + 1;
      } while (uVar7 != uVar18);
    }
  }
  pCVar1 = &this->knots_v;
  iVar9 = (int)IVar5;
  if (mknots_v == (ChVectorDynamic<> *)0x0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)(iVar9 + 1 + this->p_v));
    lVar19 = (this->knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    if (lVar19 < 0) {
LAB_0083199b:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    if (lVar19 != 0) {
      memset((pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar19 << 3);
    }
    ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(pCVar1,this->p_v,0.0,1.0);
  }
  else {
    pdVar6 = (mknots_v->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar18 = (mknots_v->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if ((this->knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != uVar18) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar18,1);
    }
    uVar7 = (this->knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_rows;
    if (uVar7 != uVar18) {
LAB_008317ef:
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                   );
    }
    pdVar8 = (pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar18 = uVar7 + 7;
    if (-1 < (long)uVar7) {
      uVar18 = uVar7;
    }
    uVar18 = uVar18 & 0xfffffffffffffff8;
    if (7 < (long)uVar7) {
      lVar19 = 0;
      do {
        pdVar3 = pdVar6 + lVar19;
        dVar10 = pdVar3[1];
        dVar11 = pdVar3[2];
        dVar12 = pdVar3[3];
        dVar13 = pdVar3[4];
        dVar14 = pdVar3[5];
        dVar15 = pdVar3[6];
        dVar16 = pdVar3[7];
        pdVar2 = pdVar8 + lVar19;
        *pdVar2 = *pdVar3;
        pdVar2[1] = dVar10;
        pdVar2[2] = dVar11;
        pdVar2[3] = dVar12;
        pdVar2[4] = dVar13;
        pdVar2[5] = dVar14;
        pdVar2[6] = dVar15;
        pdVar2[7] = dVar16;
        lVar19 = lVar19 + 8;
      } while (lVar19 < (long)uVar18);
    }
    if ((long)uVar18 < (long)uVar7) {
      do {
        pdVar8[uVar18] = pdVar6[uVar18];
        uVar18 = uVar18 + 1;
      } while (uVar7 != uVar18);
    }
  }
  if (weights == (ChMatrixDynamic<> *)0x0) {
    local_120 = 1.0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setConstant
              (&(this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
               (long)(int)local_118,(long)iVar9,&local_120);
  }
  else {
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
              (&this->weights,weights,(assign_op<double,_double> *)&local_120);
  }
  return;
}

Assistant:

void ChSurfaceNurbs::SetupData(
    int morder_u,                          // order pu: 1= linear, 2=quadratic, etc.
    int morder_v,                          // order pv: 1= linear, 2=quadratic, etc.
    ChMatrixDynamic<ChVector<>>& mpoints,  // control points, size nuxnv. Required: at least nu >= pu+1, same for v
    ChVectorDynamic<>* mknots_u,  // knots u, size ku. Required ku=nu+pu+1. If not provided, initialized to uniform.
    ChVectorDynamic<>* mknots_v,  // knots v, size kv. Required ku=nu+pu+1. If not provided, initialized to uniform.
    ChMatrixDynamic<>* weights    // weights, size nuxnv. If not provided, all weights as 1.
) {
    if (morder_u < 1)
        throw ChException("ChSurfaceNurbs::SetupData requires u order >= 1.");

    if (morder_v < 1)
        throw ChException("ChSurfaceNurbs::SetupData requires v order >= 1.");

    if (mpoints.rows() < morder_u + 1)
        throw ChException("ChSurfaceNurbs::SetupData requires at least (order_u+1)x(order_v+1) control points.");
    if (mpoints.cols() < morder_v + 1)
        throw ChException("ChSurfaceNurbs::SetupData requires at least (order_u+1)x(order_v+1) control points.");

    if (mknots_u && mknots_u->size() != (mpoints.rows() + morder_u + 1))
        throw ChException("ChSurfaceNurbs::SetupData: knots_u must have size=n_points_u+order_u+1");
    if (mknots_v && mknots_v->size() != (mpoints.cols() + morder_v + 1))
        throw ChException("ChSurfaceNurbs::SetupData: knots_v must have size=n_points_v+order_v+1");

    if (weights && (weights->rows() != mpoints.rows() || weights->cols() != mpoints.cols()))
        throw ChException("ChSurfaceNurbs::SetupData: weights matrix must have size as point matrix");

    this->p_u = morder_u;
    this->p_v = morder_v;
    this->points = mpoints;
    int n_u = (int)points.rows();
    int n_v = (int)points.cols();

    if (mknots_u)
        this->knots_u = *mknots_u;
    else {
        this->knots_u.setZero(n_u + p_u + 1);
        ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(this->knots_u, p_u);
    }
    if (mknots_v)
        this->knots_v = *mknots_v;
    else {
        this->knots_v.setZero(n_v + p_v + 1);
        ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(this->knots_v, p_v);
    }

    if (weights)
        this->weights = *weights;
    else
        this->weights.setConstant(n_u, n_v, 1.0);
}